

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::Scrollbar(ImGuiAxis axis)

{
  ImGuiWindow *window;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiID id;
  uint uVar3;
  uint uVar4;
  float fVar5;
  ImRect IVar6;
  ImRect inner_rect;
  ImVec2 local_38;
  ImVec2 IStack_30;
  ImRect local_28;
  
  window = GImGui->CurrentWindow;
  id = GetWindowScrollbarID(window,axis);
  KeepAliveID(id);
  IVar6 = ImGuiWindow::Rect(window);
  IVar1 = (window->InnerRect).Min;
  IVar2 = (window->InnerRect).Max;
  local_38 = IVar1;
  IVar1 = local_38;
  IStack_30 = IVar2;
  IVar2 = IStack_30;
  fVar5 = (&(window->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  uVar3 = (uint)((&(window->ScrollbarSizes).x)[axis] <= 0.0) << 3;
  IStack_30.x = IVar6.Max.x;
  if (axis == ImGuiAxis_X) {
    local_38.x = IVar1.x;
    IStack_30.x = IVar2.x;
    fVar5 = (IVar6.Max.y - window->WindowBorderSize) - fVar5;
    uVar4 = -(uint)(fVar5 <= IVar6.Min.y);
    local_38.y = (float)(uVar4 & (uint)IVar6.Min.y | ~uVar4 & (uint)fVar5);
    local_28.Max.y = IVar6.Max.y;
    uVar3 = uVar3 | 4;
  }
  else {
    fVar5 = (IStack_30.x - window->WindowBorderSize) - fVar5;
    uVar4 = -(uint)(fVar5 <= IVar6.Min.x);
    local_38.x = (float)(uVar4 & (uint)IVar6.Min.x | ~uVar4 & (uint)fVar5);
    local_38.y = IVar1.y;
    local_28.Max.y = (window->InnerRect).Max.y;
    uVar3 = uVar3 | (uint)~window->Flags >> 9 & -(window->Flags & 1U) & 2;
  }
  local_28.Min.x = local_38.x;
  local_28.Min.y = local_38.y;
  local_28.Max.x = IStack_30.x;
  fVar5 = (&(window->WindowPadding).x)[axis];
  local_38 = IVar1;
  IStack_30 = IVar2;
  ScrollbarEx(&local_28,id,axis,&(window->Scroll).x + axis,
              (&IStack_30.x)[axis] - (&local_38.x)[axis],
              fVar5 + fVar5 + (&(window->ContentSize).x)[axis],uVar3);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1];
    IM_ASSERT(scrollbar_size > 0.0f);
    const float other_scrollbar_size = window->ScrollbarSizes[axis];
    ImDrawCornerFlags rounding_corners = (other_scrollbar_size <= 0.0f) ? ImDrawCornerFlags_BotRight : 0;
    ImRect bb;
    if (axis == ImGuiAxis_X)
    {
        bb.Min = ImVec2(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size));
        bb.Max = ImVec2(inner_rect.Max.x, outer_rect.Max.y);
        rounding_corners |= ImDrawCornerFlags_BotLeft;
    }
    else
    {
        bb.Min = ImVec2(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y);
        bb.Max = ImVec2(outer_rect.Max.x, window->InnerRect.Max.y);
        rounding_corners |= ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0;
    }
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], inner_rect.Max[axis] - inner_rect.Min[axis], window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f, rounding_corners);
}